

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::GenObjectBuilderImplementation_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,bool prependUnderscore,bool pack)

{
  BaseType BVar1;
  FieldDef *pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  pointer ppVar3;
  string offset_name;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_124;
  DartGenerator *local_120;
  IdlNamer *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  char *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  StructDef *local_88;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_80;
  char *local_78;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppVar3 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_78 = "";
  local_124 = (int)CONCAT71(in_register_00000081,prependUnderscore);
  if (local_124 != 0) {
    local_78 = "_";
  }
  local_118 = &this->namer_;
  local_d0 = "getOrCreateOffset";
  if ((int)CONCAT71(in_register_00000089,pack) != 0) {
    local_d0 = "pack";
  }
  local_120 = this;
  local_88 = struct_def;
  local_80 = non_deprecated_fields;
  do {
    if (ppVar3 == (non_deprecated_fields->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if (local_88->fixed == false) {
        TableObjectBuilderBody_abi_cxx11_
                  (&local_f0,local_120,local_88,non_deprecated_fields,local_124._0_1_,pack);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        StructObjectBuilderBody_abi_cxx11_
                  (&local_f0,local_120,non_deprecated_fields,local_124._0_1_,pack);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)&local_f0);
      return __return_storage_ptr__;
    }
    pFVar2 = ppVar3->second;
    BVar1 = (pFVar2->value).type.base_type;
    if ((0xb < BVar1 - BASE_TYPE_UTYPE) &&
       ((BVar1 != BASE_TYPE_STRUCT || (((pFVar2->value).type.struct_def)->fixed == false)))) {
      (*(local_118->super_Namer)._vptr_Namer[7])(&local_50,local_118,pFVar2);
      std::operator+(&local_f0,&local_50,"Offset");
      std::__cxx11::string::~string((string *)&local_50);
      (*(local_118->super_Namer)._vptr_Namer[7])(&local_148,local_118,pFVar2);
      std::operator+(&local_50,local_78,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      if ((pack) &&
         ((((BVar1 = (pFVar2->value).type.base_type, BVar1 == BASE_TYPE_VECTOR64 ||
            (BVar1 == BASE_TYPE_VECTOR)) && ((pFVar2->value).type.element == BASE_TYPE_STRUCT)) &&
          (((pFVar2->value).type.struct_def)->fixed == true)))) {
        std::operator+(&local_110,"    int? ",&local_f0);
        std::operator+(&local_148,&local_110,";\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_110);
        std::operator+(&local_110,"    if (",&local_50);
        std::operator+(&local_148,&local_110," != null) {\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_110);
        std::operator+(&local_110,"      for (var e in ",&local_50);
        std::operator+(&local_148,&local_110,"!) { e.pack(fbBuilder); }\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_110);
        (*(local_118->super_Namer)._vptr_Namer[7])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   local_118,pFVar2);
        std::operator+(&local_c8,"      ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        std::operator+(&local_a8,&local_c8,"Offset = fbBuilder.endStructVector(");
        std::operator+(&local_110,&local_a8,&local_50);
        std::operator+(&local_148,&local_110,"!.length);\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)local_70);
LAB_0018ab65:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::operator+(&local_148,"    final int? ",&local_f0);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_148);
        BVar1 = (pFVar2->value).type.base_type;
        if (BVar1 == BASE_TYPE_STRING) {
          std::operator+(&local_110," = ",&local_50);
          std::operator+(&local_148,&local_110," == null ? null\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_110);
          std::operator+(&local_110,"        : fbBuilder.writeString(",&local_50);
          std::operator+(&local_148,&local_110,"!);\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0018aa6b:
          std::__cxx11::string::~string((string *)&local_148);
          this_00 = &local_110;
        }
        else {
          if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
            std::operator+(&local_110," = ",&local_50);
            std::operator+(&local_148,&local_110," == null ? null\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            BVar1 = (pFVar2->value).type.element;
            if (BVar1 == BASE_TYPE_STRING) {
              std::operator+(&local_110,"(",&local_50);
              std::operator+(&local_148,&local_110,"!.map(fbBuilder.writeString).toList());\n");
              std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              if (BVar1 != BASE_TYPE_STRUCT) {
                local_70._24_2_ = (pFVar2->value).type.fixed_length;
                local_70._4_4_ = BASE_TYPE_NONE;
                local_70._8_8_ = (pFVar2->value).type.struct_def;
                local_70._16_8_ = (pFVar2->value).type.enum_def;
                local_70._0_4_ = BVar1;
                GenType_abi_cxx11_(&local_c8,local_120,(Type *)local_70);
                std::operator+(&local_a8,&local_c8,"(");
                std::operator+(&local_110,&local_a8,&local_50);
                std::operator+(&local_148,&local_110,"!");
                std::__cxx11::string::append((string *)__return_storage_ptr__);
                std::__cxx11::string::~string((string *)&local_148);
                std::__cxx11::string::~string((string *)&local_110);
                std::__cxx11::string::~string((string *)&local_a8);
                std::__cxx11::string::~string((string *)&local_c8);
                if ((pFVar2->value).type.enum_def != (EnumDef *)0x0) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                }
                goto LAB_0018ab65;
              }
              if (((pFVar2->value).type.struct_def)->fixed != true) {
                std::operator+(&local_c8,"(",&local_50);
                std::operator+(&local_a8,&local_c8,"!.map((b) => b.");
                std::operator+(&local_110,&local_a8,local_d0);
                std::operator+(&local_148,&local_110,"(fbBuilder)).toList());\n");
                std::__cxx11::string::append((string *)__return_storage_ptr__);
                goto LAB_0018abe0;
              }
              std::operator+(&local_110,"OfStructs(",&local_50);
              std::operator+(&local_148,&local_110,"!);\n");
              std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            goto LAB_0018aa6b;
          }
          std::operator+(&local_c8," = ",&local_50);
          std::operator+(&local_a8,&local_c8,"?.");
          std::operator+(&local_110,&local_a8,local_d0);
          std::operator+(&local_148,&local_110,"(fbBuilder);\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0018abe0:
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_a8);
          this_00 = &local_c8;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_f0);
      non_deprecated_fields = local_80;
    }
    ppVar3 = ppVar3 + 1;
  } while( true );
}

Assistant:

std::string GenObjectBuilderImplementation(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      bool prependUnderscore = true, bool pack = false) {
    std::string code;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type))
        continue;

      std::string offset_name = namer_.Variable(field) + "Offset";
      std::string field_name =
          (prependUnderscore ? "_" : "") + namer_.Variable(field);
      // custom handling for fixed-sized struct in pack()
      if (pack && IsVector(field.value.type) &&
          field.value.type.VectorType().base_type == BASE_TYPE_STRUCT &&
          field.value.type.struct_def->fixed) {
        code += "    int? " + offset_name + ";\n";
        code += "    if (" + field_name + " != null) {\n";
        code +=
            "      for (var e in " + field_name + "!) { e.pack(fbBuilder); }\n";
        code += "      " + namer_.Variable(field) +
                "Offset = fbBuilder.endStructVector(" + field_name +
                "!.length);\n";
        code += "    }\n";
        continue;
      }

      code += "    final int? " + offset_name;
      if (IsVector(field.value.type)) {
        code += " = " + field_name + " == null ? null\n";
        code += "        : fbBuilder.writeList";
        switch (field.value.type.VectorType().base_type) {
          case BASE_TYPE_STRING:
            code +=
                "(" + field_name + "!.map(fbBuilder.writeString).toList());\n";
            break;
          case BASE_TYPE_STRUCT:
            if (field.value.type.struct_def->fixed) {
              code += "OfStructs(" + field_name + "!);\n";
            } else {
              code += "(" + field_name + "!.map((b) => b." +
                      (pack ? "pack" : "getOrCreateOffset") +
                      "(fbBuilder)).toList());\n";
            }
            break;
          default:
            code +=
                GenType(field.value.type.VectorType()) + "(" + field_name + "!";
            if (field.value.type.enum_def) {
              code += ".map((f) => f.value).toList()";
            }
            code += ");\n";
        }
      } else if (IsString(field.value.type)) {
        code += " = " + field_name + " == null ? null\n";
        code += "        : fbBuilder.writeString(" + field_name + "!);\n";
      } else {
        code += " = " + field_name + "?." +
                (pack ? "pack" : "getOrCreateOffset") + "(fbBuilder);\n";
      }
    }

    if (struct_def.fixed) {
      code += StructObjectBuilderBody(non_deprecated_fields, prependUnderscore,
                                      pack);
    } else {
      code += TableObjectBuilderBody(struct_def, non_deprecated_fields,
                                     prependUnderscore, pack);
    }
    return code;
  }